

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::Country::operator=(Country *this,Country *rhs)

{
  string *psVar1;
  int *piVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  ostream *poVar4;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"In country = operator:");
  std::operator<<(poVar4,(string *)rhs->cyName);
  psVar1 = rhs->cyName;
  this->cyID = rhs->cyID;
  this->cyName = psVar1;
  piVar2 = rhs->pPlayerOwnerId;
  this->cyContinent = rhs->cyContinent;
  this->pPlayerOwnerId = piVar2;
  pvVar3 = rhs->pAdjCountries;
  this->pNumberOfTroops = rhs->pNumberOfTroops;
  this->pAdjCountries = pvVar3;
  return;
}

Assistant:

void Map::Country::operator=(Map::Country& rhs){
    std::cout << "In country = operator:" << *rhs.cyName;
    this->cyID = rhs.cyID;
    this->cyName = rhs.cyName;
    this->cyContinent = rhs.cyContinent;
    this->pPlayerOwnerId = rhs.pPlayerOwnerId;
    this->pNumberOfTroops = rhs.pNumberOfTroops;
    this->pAdjCountries = rhs.pAdjCountries;
}